

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O0

_Bool GPU_IntersectRect(GPU_Rect A,GPU_Rect B,GPU_Rect *result)

{
  float fVar1;
  float fVar2;
  float fVar3;
  GPU_Rect intersection;
  float Bmax;
  float Bmin;
  float Amax;
  float Amin;
  _Bool has_horiz_intersection;
  GPU_Rect *result_local;
  float fStack_28;
  GPU_Rect B_local;
  GPU_Rect A_local;
  
  A_local.x = A.w;
  if ((((A_local.x <= 0.0) || (A_local.y = A.h, A_local.y <= 0.0)) ||
      (B_local.x = B.w, B_local.x <= 0.0)) || (B_local.y = B.h, B_local.y <= 0.0)) {
    A_local.w._3_1_ = false;
  }
  else {
    B_local.w = A.x;
    Bmin = B_local.w;
    result_local._4_4_ = B.x;
    if (B_local.w < result_local._4_4_) {
      Bmin = result_local._4_4_;
    }
    fVar2 = Bmin;
    Bmax = B_local.w + A_local.x;
    if (result_local._4_4_ + B_local.x < B_local.w + A_local.x) {
      Bmax = result_local._4_4_ + B_local.x;
    }
    fVar1 = Bmax;
    fVar3 = Bmax - Bmin;
    B_local.h = A.y;
    Bmin = B_local.h;
    fStack_28 = B.y;
    if (B_local.h < fStack_28) {
      Bmin = fStack_28;
    }
    Bmax = B_local.h + A_local.y;
    if (fStack_28 + B_local.y < B_local.h + A_local.y) {
      Bmax = fStack_28 + B_local.y;
    }
    if ((fVar1 <= fVar2) || (Bmax <= Bmin)) {
      A_local.w._3_1_ = false;
    }
    else {
      if (result != (GPU_Rect *)0x0) {
        result->x = fVar2;
        result->y = Bmin;
        result->w = fVar3;
        result->h = Bmax - Bmin;
      }
      A_local.w._3_1_ = true;
    }
  }
  return A_local.w._3_1_;
}

Assistant:

GPU_bool GPU_IntersectRect(GPU_Rect A, GPU_Rect B, GPU_Rect* result)
{
    GPU_bool has_horiz_intersection = GPU_FALSE;
    float Amin, Amax, Bmin, Bmax;
    GPU_Rect intersection;

    // Special case for empty rects
    if (A.w <= 0.0f || A.h <= 0.0f || B.w <= 0.0f || B.h <= 0.0f)
        return GPU_FALSE;

    // Horizontal intersection
    Amin = A.x;
    Amax = Amin + A.w;
    Bmin = B.x;
    Bmax = Bmin + B.w;
    if (Bmin > Amin)
        Amin = Bmin;
    if (Bmax < Amax)
        Amax = Bmax;
    
    intersection.x = Amin;
    intersection.w = Amax - Amin;
    
    has_horiz_intersection = (Amax > Amin);

    // Vertical intersection
    Amin = A.y;
    Amax = Amin + A.h;
    Bmin = B.y;
    Bmax = Bmin + B.h;
    if (Bmin > Amin)
        Amin = Bmin;
    if (Bmax < Amax)
        Amax = Bmax;
    
    intersection.y = Amin;
    intersection.h = Amax - Amin;
    
    if(has_horiz_intersection && Amax > Amin)
    {
        if(result != NULL)
            *result = intersection;
        return GPU_TRUE;
    }
    else
        return GPU_FALSE;
}